

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O0

void __thiscall QGestureManager::QGestureManager(QGestureManager *this,QObject *parent)

{
  QPanGestureRecognizer *this_00;
  QGestureManager *this_01;
  QObject *in_RSI;
  QObject *in_RDI;
  QGestureRecognizer *in_stack_00000008;
  int in_stack_ffffffffffffffbc;
  QGestureManager *in_stack_ffffffffffffffd0;
  
  QObject::QObject(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d073c0;
  QMultiMap<Qt::GestureType,_QGestureRecognizer_*>::QMultiMap
            ((QMultiMap<Qt::GestureType,_QGestureRecognizer_*> *)0x305272);
  QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x305280);
  QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x30528e);
  QMap<QGestureManager::ObjectGesture,_QList<QGesture_*>_>::QMap
            ((QMap<QGestureManager::ObjectGesture,_QList<QGesture_*>_> *)0x30529c);
  QHash<QGesture_*,_QGestureRecognizer_*>::QHash
            ((QHash<QGesture_*,_QGestureRecognizer_*> *)(in_RDI + 0x30));
  QHash<QGesture_*,_QObject_*>::QHash((QHash<QGesture_*,_QObject_*> *)(in_RDI + 0x38));
  QHash<QGesture_*,_QPointer<QWidget>_>::QHash
            ((QHash<QGesture_*,_QPointer<QWidget>_> *)(in_RDI + 0x40));
  *(undefined4 *)(in_RDI + 0x48) = 0x100;
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::QHash
            ((QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *)(in_RDI + 0x50));
  QHash<QGesture_*,_QGestureRecognizer_*>::QHash
            ((QHash<QGesture_*,_QGestureRecognizer_*> *)(in_RDI + 0x58));
  QSet<QGesture_*>::QSet((QSet<QGesture_*> *)0x3052f7);
  qRegisterMetaType<Qt::GestureState>();
  this_00 = (QPanGestureRecognizer *)operator_new(0x10);
  panTouchPoints();
  QPanGestureRecognizer::QPanGestureRecognizer(this_00,in_stack_ffffffffffffffbc);
  registerGestureRecognizer(in_stack_ffffffffffffffd0,in_stack_00000008);
  operator_new(8);
  QPinchGestureRecognizer::QPinchGestureRecognizer((QPinchGestureRecognizer *)this_00);
  registerGestureRecognizer(in_stack_ffffffffffffffd0,in_stack_00000008);
  this_01 = (QGestureManager *)operator_new(8);
  QSwipeGestureRecognizer::QSwipeGestureRecognizer((QSwipeGestureRecognizer *)this_00);
  registerGestureRecognizer(this_01,in_stack_00000008);
  operator_new(8);
  QTapGestureRecognizer::QTapGestureRecognizer((QTapGestureRecognizer *)this_00);
  registerGestureRecognizer(this_01,in_stack_00000008);
  operator_new(8);
  QTapAndHoldGestureRecognizer::QTapAndHoldGestureRecognizer
            ((QTapAndHoldGestureRecognizer *)this_00);
  registerGestureRecognizer(this_01,in_stack_00000008);
  return;
}

Assistant:

QGestureManager::QGestureManager(QObject *parent)
    : QObject(parent), m_lastCustomGestureId(Qt::CustomGesture)
{
    qRegisterMetaType<Qt::GestureState>();

#if defined(Q_OS_MACOS)
    registerGestureRecognizer(new QMacSwipeGestureRecognizer);
    registerGestureRecognizer(new QMacPinchGestureRecognizer);
    registerGestureRecognizer(new QMacPanGestureRecognizer);
#else
    registerGestureRecognizer(new QPanGestureRecognizer(panTouchPoints()));
    registerGestureRecognizer(new QPinchGestureRecognizer);
    registerGestureRecognizer(new QSwipeGestureRecognizer);
    registerGestureRecognizer(new QTapGestureRecognizer);
#endif
    registerGestureRecognizer(new QTapAndHoldGestureRecognizer);
}